

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O3

Var Js::JavascriptMap::EntrySet(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Var aValue;
  JavascriptMap *this;
  RecyclableObject *key;
  RecyclableObject *value;
  uint64 uVar6;
  uint64 uVar7;
  int in_stack_00000010;
  CallInfo local_48;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_48 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0xed,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cd3cd9;
    *puVar5 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_48);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  aValue = Arguments::operator[]((Arguments *)&callInfo_local,0);
  bVar3 = VarIs<Js::JavascriptMap>(aValue);
  if (bVar3) {
    this = UnsafeVarTo<Js::JavascriptMap>(aValue);
    if (this != (JavascriptMap *)0x0) {
      uVar4 = callInfo_local._0_4_;
      if (((ulong)callInfo_local & 0xfffffe) == 0) {
        key = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              undefinedValue.ptr;
      }
      else {
        key = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,1);
        uVar4 = callInfo_local._0_4_;
      }
      if ((uVar4 & 0xffffff) < 3) {
        value = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
                .undefinedValue.ptr;
      }
      else {
        value = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,2);
      }
      if ((ulong)key >> 0x32 != 0) {
        bVar3 = NumberUtilities::IsSpecial
                          ((double)((ulong)key ^ 0xfffc000000000000),0x8000000000000000);
        if (bVar3) {
          uVar6 = NumberUtilities::ToSpecial(0.0);
          bVar3 = NumberUtilities::IsNan(0.0);
          if (bVar3) {
            uVar7 = NumberUtilities::ToSpecial(0.0);
            if (uVar7 != 0xfff8000000000000) {
              uVar7 = NumberUtilities::ToSpecial(0.0);
              if (uVar7 != 0x7ff8000000000000) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar5 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                            ,0xa2,
                                            "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                            ,"We should only produce a NaN with this value");
                if (!bVar3) {
LAB_00cd3cd9:
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                *puVar5 = 0;
              }
            }
          }
          key = (RecyclableObject *)(uVar6 ^ 0xfffc000000000000);
        }
      }
      Set(this,key,value);
      return this;
    }
  }
  JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec04,L"Map.prototype.set",L"Map");
}

Assistant:

Var JavascriptMap::EntrySet(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    JavascriptMap* map = JavascriptOperators::TryFromVar<JavascriptMap>(args[0]);
    if (map == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map.prototype.set"), _u("Map"));
    }

    Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();
    Var value = (args.Info.Count > 2) ? args[2] : scriptContext->GetLibrary()->GetUndefined();

    if (JavascriptNumber::Is(key) && JavascriptNumber::IsNegZero(JavascriptNumber::GetValue(key)))
    {
        // Normalize -0 to +0
        key = JavascriptNumber::New(0.0, scriptContext);
    }

    map->Set(key, value);

    return map;
}